

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBox::setEditText(QComboBox *this,QString *text)

{
  QLineEdit *this_00;
  long in_FS_OFFSET;
  QVariant QStack_88;
  code *local_68;
  undefined1 *local_60;
  QComboBox *pQStack_58;
  undefined1 *local_50;
  anon_union_24_3_e3d07ef4_for_data aStack_48;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEdit **)(*(long *)&(this->super_QWidget).field_0x8 + 0x2a0);
  if (this_00 != (QLineEdit *)0x0) {
    QLineEdit::setText(this_00,text);
  }
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aStack_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_58 = (QComboBox *)&DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant(&QStack_88,(QString *)text);
  local_60._0_4_ = 0x80c1;
  local_50 = (undefined1 *)CONCAT44(local_50._4_4_,0xffffffff);
  local_68 = QTextDocument::setMarkdown;
  pQStack_58 = this;
  ::QVariant::QVariant((QVariant *)&aStack_48,&QStack_88);
  local_60 = (undefined1 *)CONCAT44(local_60._4_4_,0x800e);
  ::QVariant::~QVariant(&QStack_88);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
  QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setEditText(const QString &text)
{
    Q_D(QComboBox);
    if (d->lineEdit)
        d->lineEdit->setText(text);
#if QT_CONFIG(accessibility)
    QAccessibleValueChangeEvent event(this, text);
    QAccessible::updateAccessibility(&event);
#endif
}